

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  int local_2c;
  int i;
  FILE *output;
  FILE *input;
  char **argv_local;
  int argc_local;
  
  local_2c = 1;
  while ((local_2c < argc && (*argv[local_2c] == '-'))) {
    iVar1 = local_2c + 1;
    if (argv[local_2c][1] == 'b') {
      flag_predict_probability = atoi(argv[iVar1]);
      local_2c = iVar1;
    }
    else if (argv[local_2c][1] == 'q') {
      info = print_null;
    }
    else {
      fprintf(_stderr,"unknown option: -%c\n",(ulong)(uint)(int)argv[local_2c][1]);
      exit_with_help();
      local_2c = iVar1;
    }
    local_2c = local_2c + 1;
  }
  if (argc <= local_2c) {
    exit_with_help();
  }
  __stream = fopen(argv[local_2c],"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"can\'t open input file %s\n",argv[local_2c]);
    exit(1);
  }
  __stream_00 = fopen(argv[local_2c + 2],"w");
  if (__stream_00 == (FILE *)0x0) {
    fprintf(_stderr,"can\'t open output file %s\n",argv[local_2c + 2]);
    exit(1);
  }
  model_ = (model *)load_model(argv[local_2c + 1]);
  if (model_ != (model *)0x0) {
    x = (feature_node *)malloc((long)max_nr_attr << 4);
    do_predict((FILE *)__stream,(FILE *)__stream_00);
    free_and_destroy_model(&model_);
    free(line);
    free(x);
    fclose(__stream);
    fclose(__stream_00);
    return 0;
  }
  fprintf(_stderr,"can\'t open model file %s\n",argv[local_2c + 1]);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	FILE *input, *output;
	int i;

	// parse options
	for(i=1;i<argc;i++)
	{
		if(argv[i][0] != '-') break;
		++i;
		switch(argv[i-1][1])
		{
			case 'b':
				flag_predict_probability = atoi(argv[i]);
				break;
			case 'q':
				info = &print_null;
				i--;
				break;
			default:
				fprintf(stderr,"unknown option: -%c\n", argv[i-1][1]);
				exit_with_help();
				break;
		}
	}
	if(i>=argc)
		exit_with_help();

	input = fopen(argv[i],"r");
	if(input == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",argv[i]);
		exit(1);
	}

	output = fopen(argv[i+2],"w");
	if(output == NULL)
	{
		fprintf(stderr,"can't open output file %s\n",argv[i+2]);
		exit(1);
	}

	if((model_=load_model(argv[i+1]))==0)
	{
		fprintf(stderr,"can't open model file %s\n",argv[i+1]);
		exit(1);
	}

	x = (struct feature_node *) malloc(max_nr_attr*sizeof(struct feature_node));
	do_predict(input, output);
	free_and_destroy_model(&model_);
	free(line);
	free(x);
	fclose(input);
	fclose(output);
	return 0;
}